

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O2

void __thiscall QPDFJob::UnderOverlay::~UnderOverlay(UnderOverlay *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&this->pdf);
  std::__cxx11::string::~string((string *)&this->repeat_nr);
  std::__cxx11::string::~string((string *)&this->from_nr);
  std::__cxx11::string::~string((string *)&this->to_nr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }